

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O0

void duckdb::BitStringAggOperation::
     Combine<duckdb::BitAggState<unsigned_long>,duckdb::BitStringAggOperation>
               (BitAggState<unsigned_long> *source,BitAggState<unsigned_long> *target,
               AggregateInputData *param_3)

{
  string_t input;
  string_t *in_RCX;
  byte *in_RSI;
  byte *in_RDI;
  BitAggState<unsigned_long> *unaff_retaddr;
  undefined8 in_stack_00000008;
  
  if ((*in_RDI & 1) != 0) {
    if ((*in_RSI & 1) == 0) {
      input.value.pointer.ptr = (char *)param_3;
      input.value._0_8_ = in_stack_00000008;
      Assign<duckdb::string_t,duckdb::BitAggState<unsigned_long>>(unaff_retaddr,input);
      *in_RSI = 1;
      *(undefined8 *)(in_RSI + 0x18) = *(undefined8 *)(in_RDI + 0x18);
      *(undefined8 *)(in_RSI + 0x20) = *(undefined8 *)(in_RDI + 0x20);
    }
    else {
      duckdb::Bit::BitwiseOr
                ((Bit *)(in_RDI + 8),(string_t *)(in_RSI + 8),(string_t *)(in_RSI + 8),in_RCX);
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_set) {
			return;
		}
		if (!target.is_set) {
			Assign(target, source.value);
			target.is_set = true;
			target.min = source.min;
			target.max = source.max;
		} else {
			Bit::BitwiseOr(source.value, target.value, target.value);
		}
	}